

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O0

void __thiscall LightMask::forwardProp(LightMask *this,vector<float,_std::allocator<float>_> *walls)

{
  float fVar1;
  float neighbor2;
  int iVar2;
  reference pvVar3;
  const_reference pvVar4;
  float fVar5;
  int local_24;
  int local_20;
  int x_1;
  int y;
  int x;
  vector<float,_std::allocator<float>_> *walls_local;
  LightMask *this_local;
  
  for (x_1 = 1; x_1 < this->width_; x_1 = x_1 + 1) {
    iVar2 = idx(this,x_1,0);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
    fVar5 = *pvVar3;
    iVar2 = idx(this,x_1 + -1,0);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
    fVar1 = *pvVar3;
    iVar2 = idx(this,x_1,0);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](walls,(long)iVar2);
    fVar5 = computeIntensity(this,fVar5,fVar1,0.0,*pvVar4);
    iVar2 = idx(this,x_1,0);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
    *pvVar3 = fVar5;
  }
  for (local_20 = 1; local_20 < this->height_; local_20 = local_20 + 1) {
    iVar2 = idx(this,0,local_20);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
    fVar5 = *pvVar3;
    iVar2 = idx(this,0,local_20 + -1);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
    fVar1 = *pvVar3;
    iVar2 = idx(this,0,local_20);
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](walls,(long)iVar2);
    fVar5 = computeIntensity(this,fVar5,fVar1,0.0,*pvVar4);
    iVar2 = idx(this,0,local_20);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
    *pvVar3 = fVar5;
    for (local_24 = 1; local_24 < this->width_; local_24 = local_24 + 1) {
      iVar2 = idx(this,local_24,local_20);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
      fVar5 = *pvVar3;
      iVar2 = idx(this,local_24 + -1,local_20);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
      fVar1 = *pvVar3;
      iVar2 = idx(this,local_24,local_20 + -1);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
      neighbor2 = *pvVar3;
      iVar2 = idx(this,local_24,local_20);
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](walls,(long)iVar2);
      fVar5 = computeIntensity(this,fVar5,fVar1,neighbor2,*pvVar4);
      iVar2 = idx(this,local_24,local_20);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->mask,(long)iVar2);
      *pvVar3 = fVar5;
    }
  }
  return;
}

Assistant:

void forwardProp(const std::vector<float>& walls)
    {
        for (int x = 1; x < width_; x++)
        {
            // Only compare to pixel on the left
            mask[idx(x,0)] = computeIntensity(mask[idx(x,0)], mask[idx(x-1, 0)], 0.0f, walls[idx(x,0)]);
        }
        for (int y = 1; y < height_; y++)
        {
            // First pixel
            // Only compare to pixel above
            mask[idx(0,y)] = computeIntensity(mask[idx(0,y)], mask[idx(0, y-1)], 0.0f, walls[idx(0,y)] );

            // All other pixels: compare to pixel above and to the left
            for (int x = 1; x < width_; x++)
            {
                mask[idx(x,y)] = computeIntensity(
                        mask[ idx(x,   y)],
                        mask[ idx(x-1, y)],
                        mask[ idx(x,   y-1)],
                        walls[idx(x,   y)] );
            }
        }
    }